

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void sse::ConvertToRgb(uint8_t *outY,uint8_t *outYEnd,uint8_t *inY,uint32_t rowSizeOut,
                      uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,
                      uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 (*pauVar7) [16];
  uint8_t *puVar8;
  uint8_t *__s;
  ulong uVar9;
  
  if (outY != outYEnd) {
    puVar8 = inY + totalSimdWidth;
    do {
      auVar5 = _DAT_001ddaf0;
      auVar4 = _DAT_001ddae0;
      auVar3 = _DAT_001ddad0;
      if (simdWidth != 0) {
        lVar6 = 0;
        pauVar7 = (undefined1 (*) [16])inY;
        do {
          auVar1 = *pauVar7;
          auVar2 = vpshufb_avx(auVar1,auVar3);
          *(undefined1 (*) [16])(outY + lVar6) = auVar2;
          auVar2 = vpshufb_avx(auVar1,auVar4);
          *(undefined1 (*) [16])(outY + lVar6 + 0x10) = auVar2;
          auVar1 = vpshufb_avx(auVar1,auVar5);
          *(undefined1 (*) [16])(outY + lVar6 + 0x20) = auVar1;
          pauVar7 = pauVar7 + 1;
          lVar6 = lVar6 + 0x30;
        } while ((ulong)simdWidth * 0x30 != lVar6);
      }
      if (nonSimdWidth != 0) {
        __s = outY + totalSimdWidth * colorCount;
        uVar9 = 0;
        do {
          memset(__s,(uint)puVar8[uVar9],(ulong)colorCount);
          __s = __s + colorCount;
          uVar9 = uVar9 + 1;
        } while (nonSimdWidth != uVar9);
      }
      outY = outY + rowSizeOut;
      inY = *(undefined1 (*) [16])inY + rowSizeIn;
      puVar8 = puVar8 + rowSizeIn;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void ConvertToRgb( uint8_t * outY, const uint8_t * outYEnd, const uint8_t * inY, uint32_t rowSizeOut, uint32_t rowSizeIn,
                       uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl1 = _mm_setr_epi8( 0, 0, 0, 1, 1, 1, 2, 2, 2, 3, 3, 3, 4, 4, 4, 5 );
        const simd ctrl2 = _mm_setr_epi8( 5, 5, 6, 6, 6, 7, 7, 7, 8, 8, 8, 9, 9, 9, 10, 10 );
        const simd ctrl3 = _mm_setr_epi8( 10, 11, 11, 11, 12, 12, 12, 13, 13, 13, 14, 14, 14, 15, 15, 15 );
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src = reinterpret_cast<const simd*>(inY);
            simd       * dst = reinterpret_cast<simd*>(outY);

            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                const simd src1 = _mm_loadu_si128( src );

                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl1 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl2 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl3 ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth*colorCount;

                const uint8_t * inXEnd = inX + nonSimdWidth;

                for( ; inX != inXEnd; outX += colorCount, ++inX )
                    memset( outX, (*inX), sizeof( uint8_t ) * colorCount );
            }
        }
    }